

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

double ** multiply_matrix(double **x,int m,int n,double **y,int v,int b)

{
  allocator local_61;
  string local_60 [32];
  double **local_40;
  double **tmp;
  int local_30;
  int j;
  int l;
  int k;
  int b_local;
  int v_local;
  double **y_local;
  int n_local;
  int m_local;
  double **x_local;
  
  l = b;
  k = v;
  _b_local = y;
  y_local._0_4_ = n;
  y_local._4_4_ = m;
  _n_local = x;
  local_40 = matrix(1,(long)m,1,(long)b);
  if ((int)y_local != k) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"bad dimensions in mulitply_matrix()",&local_61);
    nrerror((string *)local_60);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  for (j = 1; j <= y_local._4_4_; j = j + 1) {
    for (local_30 = 1; local_30 <= l; local_30 = local_30 + 1) {
      local_40[j][local_30] = 0.0;
    }
  }
  for (j = 1; j <= y_local._4_4_; j = j + 1) {
    for (local_30 = 1; local_30 <= l; local_30 = local_30 + 1) {
      for (tmp._4_4_ = 1; tmp._4_4_ <= k; tmp._4_4_ = tmp._4_4_ + 1) {
        local_40[j][local_30] =
             _n_local[j][tmp._4_4_] * _b_local[tmp._4_4_][local_30] + local_40[j][local_30];
      }
    }
  }
  return local_40;
}

Assistant:

double **multiply_matrix(double **x, int m, int n, double **y, int v, int b) {
    int k, l, j;
    double **tmp;

    tmp = matrix(1, m, 1, b);
    if (n != v) nrerror("bad dimensions in mulitply_matrix()");
    for (k = 1; k <= m; k++)
        for (l = 1; l <= b; l++)
            tmp[k][l] = 0;

    for (k = 1; k <= m; k++) {     /* row of x */
        for (l = 1; l <= b; l++) {    /* column of x */

            for (j = 1; j <= v; j++) {
                tmp[k][l] += x[k][j] * y[j][l];
            }
        }
    }
    return tmp;
}